

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O3

int luabridge::detail::
    Invoke<bool,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<int,luabridge::detail::TypeList<int,luabridge::detail::TypeList<int,luabridge::detail::TypeList<bool,void>>>>>>,1>
    ::run<bool(*)(char_const*,char_const*,int,int,int,bool)>
              (lua_State *L,_func_bool_char_ptr_char_ptr_int_int_int_bool **fn)

{
  bool bVar1;
  char *pcVar2;
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>,_2>
  local_38;
  
  pcVar2 = Stack<const_char_*>::get(L,1);
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>,_2>
  ::ArgList(&local_38,L);
  bVar1 = (**fn)(pcVar2,local_38.
                        super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>
                        .hd,
                 local_38.
                 super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>
                 .tl.hd,local_38.
                        super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>
                        .tl.tl.hd,
                 local_38.
                 super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>
                 .tl.tl.tl.hd,
                 (bool)(local_38.
                        super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>
                        .tl.tl.tl.tl.hd & 1));
  lua_pushboolean(L,(uint)bVar1);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }